

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

Iterator * leveldb::Table::BlockReader(void *arg,ReadOptions *options,Slice *index_value)

{
  bool bVar1;
  uint64_t value;
  size_t sVar2;
  Iterator *pIVar3;
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  Iterator *iter;
  Slice key;
  char cache_key_buffer [16];
  BlockContents contents;
  Status s;
  Slice input;
  BlockHandle handle;
  Handle *cache_handle;
  Block *block;
  Cache *block_cache;
  Table *table;
  BlockContents *in_stack_000000f8;
  BlockHandle *in_stack_00000100;
  ReadOptions *in_stack_00000108;
  Options *in_stack_00000110;
  RandomAccessFile *in_stack_00000118;
  Status *in_stack_ffffffffffffff18;
  Status *in_stack_ffffffffffffff20;
  Iterator *in_stack_ffffffffffffff28;
  Block *in_stack_ffffffffffffff30;
  Iterator *in_stack_ffffffffffffff38;
  Iterator *in_stack_ffffffffffffff40;
  Slice *in_stack_ffffffffffffff50;
  Block *in_stack_ffffffffffffff58;
  Slice local_98;
  char local_88 [8];
  char acStack_80 [24];
  byte local_68;
  Status local_60;
  undefined8 local_58;
  undefined8 local_50;
  BlockHandle local_48;
  long local_38;
  Iterator *local_30;
  Block *local_28;
  long *local_20;
  undefined8 *local_18;
  long local_10;
  
  local_28 = *(Block **)(*in_RDI + 0x30);
  local_30 = (Iterator *)0x0;
  local_38 = 0;
  local_20 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  BlockHandle::BlockHandle(&local_48);
  local_58 = *local_18;
  local_50 = local_18[1];
  BlockHandle::DecodeFrom((BlockHandle *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  bVar1 = Status::ok(&local_60);
  if (bVar1) {
    BlockContents::BlockContents((BlockContents *)0x138fb7);
    if (local_28 == (Block *)0x0) {
      ReadBlock(in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
                in_stack_000000f8);
      Status::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      Status::~Status(in_stack_ffffffffffffff20);
      bVar1 = Status::ok(&local_60);
      if (bVar1) {
        in_stack_ffffffffffffff28 = (Iterator *)operator_new(0x18);
        Block::Block(in_stack_ffffffffffffff30,(BlockContents *)in_stack_ffffffffffffff28);
        local_30 = in_stack_ffffffffffffff28;
      }
    }
    else {
      EncodeFixed64(local_88,*(uint64_t *)(*local_20 + 0x870));
      value = BlockHandle::offset(&local_48);
      EncodeFixed64(acStack_80,value);
      Slice::Slice(&local_98,local_88,0x10);
      local_38 = (**(code **)(local_28->data_ + 0x18))(local_28,&local_98);
      if (local_38 == 0) {
        ReadBlock(in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
                  in_stack_000000f8);
        Status::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        Status::~Status(in_stack_ffffffffffffff20);
        bVar1 = Status::ok(&local_60);
        if (bVar1) {
          pIVar3 = (Iterator *)operator_new(0x18);
          Block::Block(in_stack_ffffffffffffff30,(BlockContents *)in_stack_ffffffffffffff28);
          in_stack_ffffffffffffff40 = pIVar3;
          local_30 = pIVar3;
          if (((local_68 & 1) != 0) && ((*(byte *)(local_10 + 1) & 1) != 0)) {
            in_stack_ffffffffffffff30 = local_28;
            sVar2 = Block::size((Block *)pIVar3);
            local_38 = (**(code **)(in_stack_ffffffffffffff30->data_ + 0x10))
                                 (in_stack_ffffffffffffff30,&local_98,pIVar3,sVar2,DeleteCachedBlock
                                 );
            in_stack_ffffffffffffff38 = pIVar3;
          }
        }
      }
      else {
        local_30 = (Iterator *)(**(code **)(local_28->data_ + 0x28))(local_28,local_38);
      }
    }
  }
  if (local_30 == (Iterator *)0x0) {
    pIVar3 = NewErrorIterator(in_stack_ffffffffffffff20);
  }
  else {
    pIVar3 = Block::NewIterator(in_stack_ffffffffffffff58,(Comparator *)in_stack_ffffffffffffff50);
    if (local_38 == 0) {
      Iterator::RegisterCleanup
                (in_stack_ffffffffffffff40,(CleanupFunction)in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    else {
      Iterator::RegisterCleanup
                (in_stack_ffffffffffffff40,(CleanupFunction)in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  Status::~Status((Status *)pIVar3);
  return pIVar3;
}

Assistant:

Iterator* Table::BlockReader(void* arg, const ReadOptions& options,
                             const Slice& index_value) {
  Table* table = reinterpret_cast<Table*>(arg);
  Cache* block_cache = table->rep_->options.block_cache;
  Block* block = nullptr;
  Cache::Handle* cache_handle = nullptr;

  BlockHandle handle;
  Slice input = index_value;
  Status s = handle.DecodeFrom(&input);
  // We intentionally allow extra stuff in index_value so that we
  // can add more features in the future.

  if (s.ok()) {
    BlockContents contents;
    if (block_cache != nullptr) {
      char cache_key_buffer[16];
      EncodeFixed64(cache_key_buffer, table->rep_->cache_id);
      EncodeFixed64(cache_key_buffer + 8, handle.offset());
      Slice key(cache_key_buffer, sizeof(cache_key_buffer));
      cache_handle = block_cache->Lookup(key);
      if (cache_handle != nullptr) {
        block = reinterpret_cast<Block*>(block_cache->Value(cache_handle));
      } else {
        s = ReadBlock(table->rep_->file, table->rep_->options, options, handle, &contents);
        if (s.ok()) {
          block = new Block(contents);
          if (contents.cachable && options.fill_cache) {
            cache_handle = block_cache->Insert(key, block, block->size(),
                                               &DeleteCachedBlock);
          }
        }
      }
    } else {
      s = ReadBlock(table->rep_->file, table->rep_->options, options, handle, &contents);
      if (s.ok()) {
        block = new Block(contents);
      }
    }
  }

  Iterator* iter;
  if (block != nullptr) {
    iter = block->NewIterator(table->rep_->options.comparator);
    if (cache_handle == nullptr) {
      iter->RegisterCleanup(&DeleteBlock, block, nullptr);
    } else {
      iter->RegisterCleanup(&ReleaseBlock, block_cache, cache_handle);
    }
  } else {
    iter = NewErrorIterator(s);
  }
  return iter;
}